

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<bool> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<bool>(BuiltinPrecisionTests *this,Expr<bool> *ptr)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<bool> EVar3;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> local_28;
  SharedPtrStateBase *pSVar2;
  
  local_28.m_state = (SharedPtrStateBase *)0x0;
  local_28.m_ptr = ptr;
  local_28.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_28.m_state)->strongRefCount = 0;
  (local_28.m_state)->weakRefCount = 0;
  (local_28.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d454e0;
  local_28.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)ptr;
  (local_28.m_state)->strongRefCount = 1;
  (local_28.m_state)->weakRefCount = 1;
  EVar3 = exprP<bool>(this,&local_28);
  pSVar2 = EVar3.super_ExprPBase<bool>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.m_ptr = (Expr<bool> *)0x0;
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_28.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_28.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_state = pSVar2;
  EVar3.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_ptr = (Expr<bool> *)this;
  return (ExprP<bool>)
         EVar3.super_ExprPBase<bool>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}